

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O1

void prune_head(bufq *q)

{
  buf_chunk *pbVar1;
  buf_chunk *pbVar2;
  bufc_pool *pbVar3;
  
  pbVar1 = q->head;
  do {
    if ((pbVar1 == (buf_chunk *)0x0) || (pbVar1->r_offset < pbVar1->w_offset)) {
      return;
    }
    pbVar2 = pbVar1->next;
    q->head = pbVar2;
    if (q->tail == pbVar1) {
      q->tail = pbVar2;
    }
    pbVar3 = q->pool;
    if (pbVar3 == (bufc_pool *)0x0) {
      if ((q->max_chunks < q->chunk_count) || ((q->opts & 2) != 0)) goto LAB_006bac0b;
      pbVar1->next = q->spare;
      q->spare = pbVar1;
    }
    else {
      if (pbVar3->spare_count < pbVar3->spare_max) {
        pbVar1->next = (buf_chunk *)0x0;
        pbVar1->r_offset = 0;
        pbVar1->w_offset = 0;
        pbVar1->next = pbVar3->spare;
        pbVar3->spare = pbVar1;
        pbVar3->spare_count = pbVar3->spare_count + 1;
      }
      else {
LAB_006bac0b:
        (*Curl_cfree)(pbVar1);
      }
      q->chunk_count = q->chunk_count - 1;
    }
    pbVar1 = q->head;
  } while( true );
}

Assistant:

static void prune_head(struct bufq *q)
{
  struct buf_chunk *chunk;

  while(q->head && chunk_is_empty(q->head)) {
    chunk = q->head;
    q->head = chunk->next;
    if(q->tail == chunk)
      q->tail = q->head;
    if(q->pool) {
      bufcp_put(q->pool, chunk);
      --q->chunk_count;
    }
    else if((q->chunk_count > q->max_chunks) ||
       (q->opts & BUFQ_OPT_NO_SPARES)) {
      /* SOFT_LIMIT allowed us more than max. free spares until
       * we are at max again. Or free them if we are configured
       * to not use spares. */
      free(chunk);
      --q->chunk_count;
    }
    else {
      chunk->next = q->spare;
      q->spare = chunk;
    }
  }
}